

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int next_cache_entry(archive_read *a,iso9660 *iso9660,file_info **pfile)

{
  size_t sVar1;
  archive_vtable_conflict *paVar2;
  long lVar3;
  int iVar4;
  file_info *pfVar5;
  archive_read *a_00;
  file_info *file_00;
  archive_read *file_01;
  iso9660 *in_RDX;
  iso9660 *in_RSI;
  archive *in_RDI;
  bool bVar6;
  int r;
  int nexted_re;
  file_info *first_re;
  file_info *d;
  file_info *re;
  int count;
  int64_t number;
  anon_struct_16_2_ec647c9d empty_files;
  file_info *file;
  archive_read *local_60;
  int local_44;
  file_info *local_38;
  file_info *in_stack_ffffffffffffffd0;
  int *piVar7;
  
  pfVar5 = cache_get_entry(in_RSI);
  if (pfVar5 != (file_info *)0x0) {
    *(file_info **)in_RDX = pfVar5;
    return 0;
  }
LAB_0025e066:
  do {
    while( true ) {
      a_00 = (archive_read *)heap_get_entry(&in_RSI->pending_files);
      *(archive_read **)in_RDX = a_00;
      if (a_00 == (archive_read *)0x0) {
        if ((((in_RSI->re_files).first != (file_info *)0x0) &&
            (in_RSI->rr_moved != (file_info *)0x0)) &&
           (in_RSI->rr_moved->rr_moved_has_re_only != '\0')) {
          cache_add_entry(in_RSI,in_RSI->rr_moved);
        }
        while (pfVar5 = re_get_entry(in_RSI), pfVar5 != (file_info *)0x0) {
          while (file_00 = rede_get_entry(pfVar5), file_00 != (file_info *)0x0) {
            cache_add_entry(in_RSI,file_00);
          }
        }
        if ((in_RSI->cache_files).first != (file_info *)0x0) {
          iVar4 = next_cache_entry((archive_read *)in_RSI,in_RDX,(file_info **)a_00);
          return iVar4;
        }
        return 1;
      }
      if ((a_00->archive).error_string.buffer_length == 0) break;
      local_60 = (archive_read *)0x0;
      bVar6 = false;
      while( true ) {
        file_01 = (archive_read *)re_get_entry(in_RSI);
        if (file_01 == local_60) goto LAB_0025e28d;
        if (local_60 == (archive_read *)0x0) {
          local_60 = file_01;
        }
        sVar1._0_4_ = (file_01->archive).file_count;
        sVar1._4_4_ = (file_01->archive).archive_error_number;
        if (sVar1 == (a_00->archive).error_string.buffer_length) break;
        re_add_entry(in_RSI,(file_info *)file_01);
      }
      paVar2 = (file_01->archive).vtable;
      *(int *)&paVar2->archive_write_data = *(int *)&paVar2->archive_write_data + -1;
      (file_01->archive).vtable = (a_00->archive).vtable;
      *(undefined1 *)((long)&(file_01->archive).error_string.length + 2) = 0;
      if (*(char *)((long)&((file_01->archive).vtable)->archive_filter_count + 3) == '\0') {
        *(archive_read **)in_RDX = file_01;
        a_00 = file_01;
        while (pfVar5 = rede_get_entry((file_info *)a_00), pfVar5 != (file_info *)0x0) {
          cache_add_entry(in_RSI,pfVar5);
        }
      }
      else {
        bVar6 = true;
        *(undefined1 *)((long)&(file_01->archive).error_string.length + 3) = 1;
        iVar4 = rede_add_entry((file_info *)file_01);
        while( true ) {
          if (iVar4 < 0) {
            archive_set_error(in_RDI,-1,
                              "Failed to connect \'CL\' pointer to \'RE\' rr_moved pointer of Rockridge extensions: current position = %jd, CL offset = %jd"
                              ,in_RSI->current_position,(a_00->archive).error_string.buffer_length);
            return -0x1e;
          }
          pfVar5 = rede_get_entry((file_info *)file_01);
          if (pfVar5 == (file_info *)0x0) break;
          iVar4 = rede_add_entry(pfVar5);
        }
      }
LAB_0025e28d:
      if (!bVar6) goto LAB_0025e345;
    }
    if ((a_00->skip_file_ino & 0xf000) != 0x4000) goto LAB_0025e345;
    iVar4 = read_children(a_00,in_stack_ffffffffffffffd0);
    if (iVar4 != 0) {
      return iVar4;
    }
    if ((char)(a_00->archive).error_string.length == '\0') {
      if (*(char *)((long)&(a_00->archive).error_string.length + 2) == '\0') {
        if ((*(char *)((long)&(a_00->archive).error_string.length + 3) == '\0') ||
           (iVar4 = rede_add_entry((file_info *)a_00), iVar4 != 0)) goto LAB_0025e345;
      }
      else {
        re_add_entry(in_RSI,(file_info *)a_00);
      }
      goto LAB_0025e066;
    }
    if (*(char *)((long)&(a_00->archive).error_string.length + 1) == '\0') {
LAB_0025e345:
      if (((a_00->skip_file_ino & 0xf000) != 0x8000) || (a_00->read_data_offset == -1)) {
        return 0;
      }
      local_44 = 0;
      lVar3 = a_00->read_data_offset;
      (in_RSI->cache_files).first = (file_info *)0x0;
      (in_RSI->cache_files).last = &(in_RSI->cache_files).first;
      local_38 = (file_info *)0x0;
      piVar7 = (int *)&local_38;
      while( true ) {
        bVar6 = false;
        if ((0 < (in_RSI->pending_files).used) &&
           (bVar6 = true, (*(in_RSI->pending_files).files)->number != -1)) {
          bVar6 = (*(in_RSI->pending_files).files)->number == lVar3;
        }
        if (!bVar6) break;
        if (a_00->read_data_offset == -1) {
          *(undefined8 *)&(a_00->archive).archive_format = 0;
          *(archive_read **)piVar7 = a_00;
          piVar7 = &(a_00->archive).archive_format;
        }
        else {
          local_44 = local_44 + 1;
          cache_add_entry(in_RSI,(file_info *)a_00);
        }
        a_00 = (archive_read *)heap_get_entry(&in_RSI->pending_files);
      }
      if (local_44 == 0) {
        *(archive_read **)in_RDX = a_00;
        return (uint)(a_00 == (archive_read *)0x0);
      }
      if (a_00->read_data_offset == -1) {
        *(undefined8 *)&(a_00->archive).archive_format = 0;
        *(archive_read **)piVar7 = a_00;
        piVar7 = &(a_00->archive).archive_format;
      }
      else {
        local_44 = local_44 + 1;
        cache_add_entry(in_RSI,(file_info *)a_00);
      }
      if (1 < local_44) {
        for (pfVar5 = (in_RSI->cache_files).first; pfVar5 != (file_info *)0x0; pfVar5 = pfVar5->next
            ) {
          pfVar5->nlinks = local_44;
        }
      }
      if (local_38 != (file_info *)0x0) {
        *(in_RSI->cache_files).last = local_38;
        (in_RSI->cache_files).last = (file_info **)piVar7;
      }
      pfVar5 = cache_get_entry(in_RSI);
      *(file_info **)in_RDX = pfVar5;
      lVar3._0_4_ = in_RDX->magic;
      lVar3._4_4_ = in_RDX->opt_support_joliet;
      return (uint)(lVar3 == 0);
    }
  } while( true );
}

Assistant:

static int
next_cache_entry(struct archive_read *a, struct iso9660 *iso9660,
    struct file_info **pfile)
{
	struct file_info *file;
	struct {
		struct file_info	*first;
		struct file_info	**last;
	}	empty_files;
	int64_t number;
	int count;

	file = cache_get_entry(iso9660);
	if (file != NULL) {
		*pfile = file;
		return (ARCHIVE_OK);
	}

	for (;;) {
		struct file_info *re, *d;

		*pfile = file = next_entry(iso9660);
		if (file == NULL) {
			/*
			 * If directory entries all which are descendant of
			 * rr_moved are stil remaning, expose their. 
			 */
			if (iso9660->re_files.first != NULL && 
			    iso9660->rr_moved != NULL &&
			    iso9660->rr_moved->rr_moved_has_re_only)
				/* Expose "rr_moved" entry. */
				cache_add_entry(iso9660, iso9660->rr_moved);
			while ((re = re_get_entry(iso9660)) != NULL) {
				/* Expose its descendant dirs. */
				while ((d = rede_get_entry(re)) != NULL)
					cache_add_entry(iso9660, d);
			}
			if (iso9660->cache_files.first != NULL)
				return (next_cache_entry(a, iso9660, pfile));
			return (ARCHIVE_EOF);
		}

		if (file->cl_offset) {
			struct file_info *first_re = NULL;
			int nexted_re = 0;

			/*
			 * Find "RE" dir for the current file, which
			 * has "CL" flag.
			 */
			while ((re = re_get_entry(iso9660))
			    != first_re) {
				if (first_re == NULL)
					first_re = re;
				if (re->offset == file->cl_offset) {
					re->parent->subdirs--;
					re->parent = file->parent;
					re->re = 0;
					if (re->parent->re_descendant) {
						nexted_re = 1;
						re->re_descendant = 1;
						if (rede_add_entry(re) < 0)
							goto fatal_rr;
						/* Move a list of descendants
						 * to a new ancestor. */
						while ((d = rede_get_entry(
						    re)) != NULL)
							if (rede_add_entry(d)
							    < 0)
								goto fatal_rr;
						break;
					}
					/* Replace the current file
					 * with "RE" dir */
					*pfile = file = re;
					/* Expose its descendant */
					while ((d = rede_get_entry(
					    file)) != NULL)
						cache_add_entry(
						    iso9660, d);
					break;
				} else
					re_add_entry(iso9660, re);
			}
			if (nexted_re) {
				/*
				 * Do not expose this at this time
				 * because we have not gotten its full-path
				 * name yet.
				 */
				continue;
			}
		} else if ((file->mode & AE_IFMT) == AE_IFDIR) {
			int r;

			/* Read file entries in this dir. */
			r = read_children(a, file);
			if (r != ARCHIVE_OK)
				return (r);

			/*
			 * Handle a special dir of Rockridge extensions,
			 * "rr_moved".
			 */
			if (file->rr_moved) {
				/*
				 * If this has only the subdirectories which
				 * have "RE" flags, do not expose at this time.
				 */
				if (file->rr_moved_has_re_only)
					continue;
				/* Otherwise expose "rr_moved" entry. */
			} else if (file->re) {
				/*
				 * Do not expose this at this time
				 * because we have not gotten its full-path
				 * name yet.
				 */
				re_add_entry(iso9660, file);
				continue;
			} else if (file->re_descendant) {
				/*
				 * If the top level "RE" entry of this entry
				 * is not exposed, we, accordingly, should not
				 * expose this entry at this time because
				 * we cannot make its proper full-path name.
				 */
				if (rede_add_entry(file) == 0)
					continue;
				/* Otherwise we can expose this entry because
				 * it seems its top level "RE" has already been
				 * exposed. */
			}
		}
		break;
	}

	if ((file->mode & AE_IFMT) != AE_IFREG || file->number == -1)
		return (ARCHIVE_OK);

	count = 0;
	number = file->number;
	iso9660->cache_files.first = NULL;
	iso9660->cache_files.last = &(iso9660->cache_files.first);
	empty_files.first = NULL;
	empty_files.last = &empty_files.first;
	/* Collect files which has the same file serial number.
	 * Peek pending_files so that file which number is different
	 * is not put bak. */
	while (iso9660->pending_files.used > 0 &&
	    (iso9660->pending_files.files[0]->number == -1 ||
	     iso9660->pending_files.files[0]->number == number)) {
		if (file->number == -1) {
			/* This file has the same offset
			 * but it's wrong offset which empty files
			 * and symlink files have.
			 * NOTE: This wrong offse was recorded by
			 * old mkisofs utility. If ISO images is
			 * created by latest mkisofs, this does not
			 * happen.
			 */
			file->next = NULL;
			*empty_files.last = file;
			empty_files.last = &(file->next);
		} else {
			count++;
			cache_add_entry(iso9660, file);
		}
		file = next_entry(iso9660);
	}

	if (count == 0) {
		*pfile = file;
		return ((file == NULL)?ARCHIVE_EOF:ARCHIVE_OK);
	}
	if (file->number == -1) {
		file->next = NULL;
		*empty_files.last = file;
		empty_files.last = &(file->next);
	} else {
		count++;
		cache_add_entry(iso9660, file);
	}

	if (count > 1) {
		/* The count is the same as number of hardlink,
		 * so much so that each nlinks of files in cache_file
		 * is overwritten by value of the count.
		 */
		for (file = iso9660->cache_files.first;
		    file != NULL; file = file->next)
			file->nlinks = count;
	}
	/* If there are empty files, that files are added
	 * to the tail of the cache_files. */
	if (empty_files.first != NULL) {
		*iso9660->cache_files.last = empty_files.first;
		iso9660->cache_files.last = empty_files.last;
	}
	*pfile = cache_get_entry(iso9660);
	return ((*pfile == NULL)?ARCHIVE_EOF:ARCHIVE_OK);

fatal_rr:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
	    "Failed to connect 'CL' pointer to 'RE' rr_moved pointer of "
	    "Rockridge extensions: current position = %jd, CL offset = %jd",
	    (intmax_t)iso9660->current_position, (intmax_t)file->cl_offset);
	return (ARCHIVE_FATAL);
}